

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fftkey(char *keyword,int *status)

{
  int iVar1;
  char local_89;
  char local_88 [7];
  char testchar;
  char msg [81];
  int spaces;
  size_t ii;
  size_t maxchr;
  int *status_local;
  char *keyword_local;
  
  msg[0x4c] = '\0';
  msg[0x4d] = '\0';
  msg[0x4e] = '\0';
  msg[0x4f] = '\0';
  if (*status < 1) {
    ii = strlen(keyword);
    if (8 < ii) {
      ii = 8;
    }
    for (stack0xffffffffffffffd0 = 0; stack0xffffffffffffffd0 < ii;
        register0x00000000 = stack0xffffffffffffffd0 + 1) {
      if (*status == 0) {
        local_89 = keyword[stack0xffffffffffffffd0];
      }
      else {
        iVar1 = toupper((int)keyword[stack0xffffffffffffffd0]);
        local_89 = (char)iVar1;
      }
      if ((((local_89 < 'A') || ('Z' < local_89)) && ((local_89 < '0' || ('9' < local_89)))) &&
         ((local_89 != '-' && (local_89 != '_')))) {
        if (keyword[stack0xffffffffffffffd0] != ' ') {
          if (*status == 0) {
            snprintf(local_88,0x51,"Character %d in this keyword is illegal: %.8s",
                     (ulong)((int)stack0xffffffffffffffd0 + 1),keyword);
            ffpmsg(local_88);
            if (keyword[stack0xffffffffffffffd0] == '\0') {
              ffpmsg(" (This a NULL (0) character).");
            }
            else if (keyword[stack0xffffffffffffffd0] == '\t') {
              ffpmsg(" (This an ASCII TAB (9) character).");
            }
          }
          *status = 0xcf;
          return 0xcf;
        }
        msg[0x4c] = '\x01';
        msg[0x4d] = '\0';
        msg[0x4e] = '\0';
        msg[0x4f] = '\0';
      }
      else if (msg._76_4_ != 0) {
        if (*status == 0) {
          snprintf(local_88,0x51,"Keyword name contains embedded space(s): %.8s",keyword);
          ffpmsg(local_88);
        }
        *status = 0xcf;
        return 0xcf;
      }
    }
    keyword_local._4_4_ = *status;
  }
  else {
    keyword_local._4_4_ = *status;
  }
  return keyword_local._4_4_;
}

Assistant:

int fftkey(const char *keyword,    /* I -  keyword name */
           int *status)      /* IO - error status */
/*
  Test that the keyword name conforms to the FITS standard.  Must contain
  only capital letters, digits, minus or underscore chars.  Trailing spaces
  are allowed.  If the input status value is less than zero, then the test
  is modified so that upper or lower case letters are allowed, and no 
  error messages are printed if the keyword is not legal.
*/
{
    size_t maxchr, ii;
    int spaces=0;
    char msg[FLEN_ERRMSG], testchar;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    maxchr=strlen(keyword);
    if (maxchr > 8)
        maxchr = 8;

    for (ii = 0; ii < maxchr; ii++)
    {
        if (*status == 0)
            testchar = keyword[ii];
        else
            testchar = toupper(keyword[ii]);

        if ( (testchar >= 'A' && testchar <= 'Z') ||
             (testchar >= '0' && testchar <= '9') ||
              testchar == '-' || testchar == '_'   )
              {
                if (spaces)
                {
                  if (*status == 0)
                  {
                     /* don't print error message if status < 0  */
                    snprintf(msg, FLEN_ERRMSG,
                       "Keyword name contains embedded space(s): %.8s",
                        keyword);
                     ffpmsg(msg);
                  }
                  return(*status = BAD_KEYCHAR);        
                }
              }
        else if (keyword[ii] == ' ')
            spaces = 1;

        else     
        {
          if (*status == 0)
          {
            /* don't print error message if status < 0  */
            snprintf(msg, FLEN_ERRMSG,"Character %d in this keyword is illegal: %.8s",
                    (int) (ii+1), keyword);
            ffpmsg(msg);

            /* explicitly flag the 2 most common cases */
            if (keyword[ii] == 0) 
                ffpmsg(" (This a NULL (0) character).");                
            else if (keyword[ii] == 9)
                ffpmsg(" (This an ASCII TAB (9) character).");   
          }             

          return(*status = BAD_KEYCHAR);        
        }                
    }
    return(*status);        
}